

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O3

void __thiscall
AbstractModuleClient::AbstractModuleClient(AbstractModuleClient *this,char *id,char *addr,int port)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  
  MlmWrap::MlmWrap(&this->super_MlmWrap,id,addr,port);
  (this->super_MlmWrap)._vptr_MlmWrap = (_func_int **)&PTR__AbstractModuleClient_002e70b8;
  p_Var1 = &(this->subbedEvents)._M_t._M_impl.super__Rb_tree_header;
  (this->subbedEvents)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->subbedEvents)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->subbedEvents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->subbedEvents)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->subbedEvents)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->timestampsub = (zsock_t *)0x0;
  (this->timestampaddress)._M_dataplus._M_p = (pointer)&(this->timestampaddress).field_2;
  (this->timestampaddress)._M_string_length = 0;
  (this->timestampaddress).field_2._M_local_buf[0] = '\0';
  this->lastTimestamp = 0;
  this->lastsysTimestamp = 0;
  (this->tsmutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->tsmutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->tsmutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->tsmutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->tsmutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  bVar2 = MlmWrap::isConnectedToBroker(&this->super_MlmWrap);
  if (bVar2) {
    initializeStreams(this);
  }
  return;
}

Assistant:

AbstractModuleClient::AbstractModuleClient(const char* id, const char* addr, int port)
    : MlmWrap(id, addr, port),timestampsub(NULL) {
    if (isConnectedToBroker()) {
        initializeStreams();
    }
}